

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScenePrivate::drawItems
          (QGraphicsScenePrivate *this,QPainter *painter,QTransform *viewTransform,
          QRegion *exposedRegion,QWidget *widget)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  QArrayDataPointer<QGraphicsItem_*> local_88 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->unpolishedItems).d.size != 0) {
    _q_polishItems(this);
  }
  this->field_0xb8 = this->field_0xb8 & 0xfb;
  local_98 = 0.0;
  dStack_90 = 0.0;
  local_a8 = 0.0;
  dStack_a0 = 0.0;
  if ((exposedRegion != (QRegion *)0x0) && (this->indexMethod != NoIndex)) {
    auVar6 = QRegion::boundingRect();
    iVar3 = auVar6._4_4_ + -1;
    iVar2 = auVar6._0_4_ + -1;
    local_a8 = (double)iVar2;
    dStack_a0 = (double)iVar3;
    local_98 = (double)(((long)(auVar6._8_4_ + 1) - (long)iVar2) + 1);
    dStack_90 = (double)(((auVar6._8_8_ + 0x100000000 >> 0x20) - (long)iVar3) + 1);
    if (viewTransform != (QTransform *)0x0) {
      QTransform::inverted((bool *)local_88);
      QTransform::mapRect((QRectF *)&local_c8);
      local_98 = local_b8;
      dStack_90 = dStack_b0;
      local_a8 = local_c8;
      dStack_a0 = dStack_c0;
    }
  }
  local_88[0].size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88[0].d._0_4_ = 0xaaaaaaaa;
  local_88[0].d._4_4_ = 0xaaaaaaaa;
  local_88[0].ptr._0_4_ = 0xaaaaaaaa;
  local_88[0].ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(*(long *)this->index + 0x98))(local_88,this->index,&local_a8,0);
  lVar1 = CONCAT44(local_88[0].ptr._4_4_,local_88[0].ptr._0_4_);
  lVar5 = local_88[0].size << 3;
  for (lVar4 = 0; lVar5 != lVar4; lVar4 = lVar4 + 8) {
    drawSubtreeRecursive
              (this,*(QGraphicsItem **)(lVar1 + lVar4),painter,viewTransform,exposedRegion,widget,
               1.0,(QTransform *)0x0);
  }
  QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::drawItems(QPainter *painter, const QTransform *const viewTransform,
                                      QRegion *exposedRegion, QWidget *widget)
{
    // Make sure we don't have unpolished items before we draw.
    if (!unpolishedItems.isEmpty())
        _q_polishItems();

    updateAll = false;
    QRectF exposedSceneRect;
    if (exposedRegion && indexMethod != QGraphicsScene::NoIndex) {
        exposedSceneRect = exposedRegion->boundingRect().adjusted(-1, -1, 1, 1);
        if (viewTransform)
            exposedSceneRect = viewTransform->inverted().mapRect(exposedSceneRect);
    }
    const QList<QGraphicsItem *> tli = index->estimateTopLevelItems(exposedSceneRect, Qt::AscendingOrder);
    for (const auto subTree : tli)
        drawSubtreeRecursive(subTree, painter, viewTransform, exposedRegion, widget);
}